

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::DispatchCompute
          (DeviceContextVkImpl *this,DispatchComputeAttribs *Attribs)

{
  ResourceBindInfo *BindInfo;
  Uint32 *pUVar1;
  uint CommitSRBMask;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::DispatchCompute
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  EnsureVkCmdBuffer(this);
  EndRenderScope(this);
  BindInfo = (this->m_BindInfo)._M_elems + 1;
  DeviceContextBase<Diligent::EngineVkImplTraits>::CommittedShaderResources::DvpVerifyCacheRevisions
            (&BindInfo->super_CommittedShaderResources);
  CommitSRBMask =
       (uint)((this->m_BindInfo)._M_elems[1].super_CommittedShaderResources.ActiveSRBMask &
             ((this->m_BindInfo)._M_elems[1].super_CommittedShaderResources.StaleSRBMask |
             (this->m_BindInfo)._M_elems[1].super_CommittedShaderResources.DynamicSRBMask));
  if (CommitSRBMask != 0) {
    CommitDescriptorSets(this,BindInfo,CommitSRBMask);
  }
  DvpValidateCommittedShaderResources(this,BindInfo);
  if (((Attribs->ThreadGroupCountX != 0) && (Attribs->ThreadGroupCountY != 0)) &&
     (Attribs->ThreadGroupCountZ != 0)) {
    VulkanUtilities::VulkanCommandBuffer::Dispatch
              (&this->m_CommandBuffer,Attribs->ThreadGroupCountX,Attribs->ThreadGroupCountY,
               Attribs->ThreadGroupCountZ);
    pUVar1 = &(this->m_State).NumCommands;
    *pUVar1 = *pUVar1 + 1;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::DispatchCompute(const DispatchComputeAttribs& Attribs)
{
    TDeviceContextBase::DispatchCompute(Attribs, 0);

    PrepareForDispatchCompute();

    if (Attribs.ThreadGroupCountX > 0 && Attribs.ThreadGroupCountY > 0 && Attribs.ThreadGroupCountZ > 0)
    {
        m_CommandBuffer.Dispatch(Attribs.ThreadGroupCountX, Attribs.ThreadGroupCountY, Attribs.ThreadGroupCountZ);
        ++m_State.NumCommands;
    }
}